

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_raytracing_groups
          (Impl *this,Value *groups,VkRayTracingShaderGroupCreateInfoKHR **out_info)

{
  size_t size;
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  VkRayTracingShaderGroupCreateInfoKHR *__s;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar4;
  Type pGVar5;
  Number NVar6;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  void **outpNext;
  bool bVar7;
  undefined8 local_38;
  
  if ((groups->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x66a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar3 = (ulong)(groups->data_).s.length;
  if (uVar3 == 0) {
    __s = (VkRayTracingShaderGroupCreateInfoKHR *)0x0;
  }
  else {
    size = uVar3 * 0x30;
    __s = (VkRayTracingShaderGroupCreateInfoKHR *)
          ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (__s != (VkRayTracingShaderGroupCreateInfoKHR *)0x0) {
      memset(__s,0,size);
    }
  }
  *out_info = __s;
  if ((groups->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x68c,
                  "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)((ulong)(groups->data_).s.str & 0xffffffffffff);
  pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::End(groups);
  bVar7 = pGVar4 == this_00;
  if (!bVar7) {
    outpNext = &__s->pNext;
    do {
      ((VkRayTracingShaderGroupCreateInfoKHR *)(outpNext + -1))->sType =
           VK_STRUCTURE_TYPE_RAY_TRACING_SHADER_GROUP_CREATE_INFO_KHR;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"intersectionShader");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) {
LAB_0011bd37:
        __assert_fail("data_.f.flags & kUintFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x719,
                      "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      *(SizeType *)(outpNext + 3) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"anyHitShader");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0011bd37;
      *(SizeType *)((long)outpNext + 0x14) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"closestHitShader");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0011bd37;
      *(SizeType *)(outpNext + 2) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"generalShader");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0011bd37;
      *(SizeType *)((long)outpNext + 0xc) = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"type");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0011bd37;
      *(SizeType *)(outpNext + 1) = (pGVar5->data_).s.length;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&stack0xffffffffffffffc8,(Ch *)this_00);
      uVar1 = local_38;
      NVar6.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)this_00);
      if (uVar1 != NVar6.i64) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(this_00,"pNext");
        bVar2 = parse_pnext_chain(this,pGVar5,outpNext,(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar2) {
          return bVar7;
        }
      }
      this_00 = this_00 + 0x10;
      pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::End(groups);
      outpNext = outpNext + 6;
      bVar7 = this_00 == pGVar4;
    } while (!bVar7);
  }
  return bVar7;
}

Assistant:

bool StateReplayer::Impl::parse_raytracing_groups(const Value &groups,
                                                  const VkRayTracingShaderGroupCreateInfoKHR **out_info)
{
	auto *state = allocator.allocate_n_cleared<VkRayTracingShaderGroupCreateInfoKHR>(groups.Size());
	*out_info = state;

	for (auto itr = groups.Begin(); itr != groups.End(); ++itr, state++)
	{
		auto &group = *itr;
		state->sType = VK_STRUCTURE_TYPE_RAY_TRACING_SHADER_GROUP_CREATE_INFO_KHR;
		state->intersectionShader = group["intersectionShader"].GetUint();
		state->anyHitShader = group["anyHitShader"].GetUint();
		state->closestHitShader = group["closestHitShader"].GetUint();
		state->generalShader = group["generalShader"].GetUint();
		state->type = static_cast<VkRayTracingShaderGroupTypeKHR>(group["type"].GetUint());

		if (group.HasMember("pNext"))
			if (!parse_pnext_chain(group["pNext"], &state->pNext))
				return false;
	}

	return true;
}